

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions<google::protobuf::EnumDescriptor>
          (DescriptorBuilder *this,OptionsType *orig_options,EnumDescriptor *descriptor,
          int options_field_tag)

{
  EnumDescriptor *in_RDX;
  value_type_conflict2 *in_RDI;
  vector<int,_std::allocator<int>_> options_path;
  vector<int,_std::allocator<int>_> *in_stack_000000a8;
  EnumDescriptor *in_stack_000000b0;
  OptionsType *in_stack_000000b8;
  string *in_stack_000000c0;
  string *in_stack_000000c8;
  DescriptorBuilder *in_stack_000000d0;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  EnumDescriptor *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> local_38;
  EnumDescriptor *local_18;
  
  this_00 = &local_38;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4d3150);
  EnumDescriptor::GetLocationPath(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,in_RDI);
  EnumDescriptor::full_name_abi_cxx11_(local_18);
  EnumDescriptor::full_name_abi_cxx11_(local_18);
  AllocateOptionsImpl<google::protobuf::EnumDescriptor>
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
             in_stack_000000b0,in_stack_000000a8);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, int options_field_tag) {
  std::vector<int> options_path;
  descriptor->GetLocationPath(&options_path);
  options_path.push_back(options_field_tag);
  AllocateOptionsImpl(descriptor->full_name(), descriptor->full_name(),
                      orig_options, descriptor, options_path);
}